

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::QtAutoGen(cmGlobalGenerator *this)

{
  bool bVar1;
  cmQtAutoGenGlobalInitializer initializer;
  cmQtAutoGenGlobalInitializer cStack_b8;
  
  cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(&cStack_b8,&this->LocalGenerators);
  bVar1 = cmQtAutoGenGlobalInitializer::generate(&cStack_b8);
  cmQtAutoGenGlobalInitializer::~cmQtAutoGenGlobalInitializer(&cStack_b8);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::QtAutoGen()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmQtAutoGenGlobalInitializer initializer(this->LocalGenerators);
  return initializer.generate();
#else
  return true;
#endif
}